

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_gethostbyname.c
# Opt level: O0

void sort_addresses(hostent *host,apattern *sortlist,size_t nsort)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t ind2;
  size_t ind1;
  int i2;
  int i1;
  in_addr a2;
  in_addr a1;
  size_t nsort_local;
  apattern *sortlist_local;
  hostent *host_local;
  
  ind1._4_4_ = 0;
  _a2 = nsort;
  do {
    if (host->h_addr_list[ind1._4_4_] == (char *)0x0) {
      return;
    }
    i1 = *(int *)host->h_addr_list[ind1._4_4_];
    sVar2 = get_address_index((in_addr *)&i1,sortlist,_a2);
    iVar1 = ind1._4_4_;
    while (ind1._0_4_ = iVar1 + -1, -1 < (int)ind1) {
      i2 = *(int *)host->h_addr_list[(int)ind1];
      sVar3 = get_address_index((in_addr *)&i2,sortlist,_a2);
      if (sVar3 <= sVar2) break;
      *(int *)host->h_addr_list[iVar1] = i2;
      iVar1 = (int)ind1;
    }
    *(int *)host->h_addr_list[iVar1] = i1;
    ind1._4_4_ = ind1._4_4_ + 1;
  } while( true );
}

Assistant:

static void sort_addresses(const struct hostent  *host,
                           const struct apattern *sortlist, size_t nsort)
{
  struct in_addr a1;
  struct in_addr a2;
  int            i1;
  int            i2;
  size_t         ind1;
  size_t         ind2;

  /* This is a simple insertion sort, not optimized at all.  i1 walks
   * through the address list, with the loop invariant that everything
   * to the left of i1 is sorted.  In the loop body, the value at i1 is moved
   * back through the list (via i2) until it is in sorted order.
   *
   * The IPs are sorted in ascending order of corresponding sortlist
   * indices, with those that don't match the subnets in the sortlist
   * coming last.  There is no particular order amongst IPs that tie
   * in this sorting scheme.
   */
  for (i1 = 0; host->h_addr_list[i1]; i1++) {
    memcpy(&a1, host->h_addr_list[i1], sizeof(struct in_addr));
    ind1 = get_address_index(&a1, sortlist, nsort);
    for (i2 = i1 - 1; i2 >= 0; i2--) {
      memcpy(&a2, host->h_addr_list[i2], sizeof(struct in_addr));
      ind2 = get_address_index(&a2, sortlist, nsort);
      if (ind2 <= ind1) {
        break;
      }
      memcpy(host->h_addr_list[i2 + 1], &a2, sizeof(struct in_addr));
    }
    memcpy(host->h_addr_list[i2 + 1], &a1, sizeof(struct in_addr));
  }
}